

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * tokenExpr(Parse *pParse,int op,Token t)

{
  Expr *p_00;
  Expr *p;
  int op_local;
  Parse *pParse_local;
  Token t_local;
  
  pParse_local = (Parse *)t.z;
  t_local.z._0_4_ = t.n;
  p_00 = (Expr *)sqlite3DbMallocRawNN(pParse->db,(ulong)(uint)t_local.z + 0x49);
  t_local._8_8_ = p_00;
  if (p_00 != (Expr *)0x0) {
    p_00->op = (u8)op;
    p_00->affExpr = '\0';
    p_00->flags = 0x800000;
    p_00->pRight = (Expr *)0x0;
    p_00->pLeft = (Expr *)0x0;
    p_00->pAggInfo = (AggInfo *)0x0;
    memset(&p_00->x,0,8);
    memset(&p_00->y,0,8);
    p_00->op2 = '\0';
    p_00->iTable = 0;
    p_00->iColumn = 0;
    (p_00->u).zToken = (char *)(p_00 + 1);
    memcpy((p_00->u).zToken,pParse_local,(ulong)(uint)t_local.z);
    (p_00->u).zToken[(uint)t_local.z] = '\0';
    (p_00->w).iJoin = (int)pParse_local - (int)pParse->zTail;
    if ((""[(byte)*(p_00->u).zToken] & 0x80) != 0) {
      sqlite3DequoteExpr(p_00);
    }
    p_00->nHeight = 1;
    if (1 < pParse->eParseMode) {
      t_local._8_8_ = sqlite3RenameTokenMap(pParse,p_00,(Token *)&pParse_local);
    }
  }
  return (Expr *)t_local._8_8_;
}

Assistant:

static Expr *tokenExpr(Parse *pParse, int op, Token t){
    Expr *p = sqlite3DbMallocRawNN(pParse->db, sizeof(Expr)+t.n+1);
    if( p ){
      /* memset(p, 0, sizeof(Expr)); */
      p->op = (u8)op;
      p->affExpr = 0;
      p->flags = EP_Leaf;
      ExprClearVVAProperties(p);
      /* p->iAgg = -1; // Not required */
      p->pLeft = p->pRight = 0;
      p->pAggInfo = 0;
      memset(&p->x, 0, sizeof(p->x));
      memset(&p->y, 0, sizeof(p->y));
      p->op2 = 0;
      p->iTable = 0;
      p->iColumn = 0;
      p->u.zToken = (char*)&p[1];
      memcpy(p->u.zToken, t.z, t.n);
      p->u.zToken[t.n] = 0;
      p->w.iOfst = (int)(t.z - pParse->zTail);
      if( sqlite3Isquote(p->u.zToken[0]) ){
        sqlite3DequoteExpr(p);
      }
#if SQLITE_MAX_EXPR_DEPTH>0
      p->nHeight = 1;
#endif
      if( IN_RENAME_OBJECT ){
        return (Expr*)sqlite3RenameTokenMap(pParse, (void*)p, &t);
      }
    }
    return p;
  }